

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

qint64 __thiscall QAbstractFileEngine::readLine(QAbstractFileEngine *this,char *data,qint64 maxlen)

{
  long lVar1;
  long in_RDX;
  char *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qint64 readResult;
  qint64 readSoFar;
  char c;
  long local_50;
  long local_38;
  char *local_28;
  long local_18;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  local_28 = in_RSI;
  while( true ) {
    if (in_RDX <= local_38) {
      local_18 = local_38;
      goto LAB_0018412a;
    }
    local_9 = -0x56;
    lVar1 = (**(code **)(*in_RDI + 0x118))(in_RDI,&local_9,1);
    if (lVar1 < 1) break;
    local_38 = local_38 + 1;
    *local_28 = local_9;
    local_28 = local_28 + 1;
    local_18 = local_38;
    if (local_9 == '\n') {
LAB_0018412a:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_18;
    }
  }
  if (local_38 < 1) {
    local_50 = -1;
  }
  else {
    local_50 = local_38;
  }
  local_18 = local_50;
  goto LAB_0018412a;
}

Assistant:

qint64 QAbstractFileEngine::readLine(char *data, qint64 maxlen)
{
    qint64 readSoFar = 0;
    while (readSoFar < maxlen) {
        char c;
        qint64 readResult = read(&c, 1);
        if (readResult <= 0)
            return (readSoFar > 0) ? readSoFar : -1;
        ++readSoFar;
        *data++ = c;
        if (c == '\n')
            return readSoFar;
    }
    return readSoFar;
}